

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Stack::newCall
          (Stack *this,LocationRange *loc,HeapEntity *context,HeapObject *self,uint offset,
          BindingFrame *up_values)

{
  FrameKind FVar1;
  ulong uVar2;
  pointer __result;
  pointer pFVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  RuntimeError *__return_storage_ptr__;
  ulong uVar6;
  _Tp_alloc_type *__alloc;
  pointer __first;
  LocationRange *__n;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  *this_00;
  ulong uVar7;
  long lVar8;
  pointer pFVar9;
  string local_60;
  HeapEntity *local_40;
  HeapObject *local_38;
  
  __first = (this->stack).
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar9 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = ((long)pFVar9 - (long)__first >> 4) * -0x70a3d70a3d70a3d7;
  __n = loc;
  uVar6 = uVar2;
  do {
    uVar6 = uVar6 - 1;
    local_40 = context;
    local_38 = self;
    if ((int)(uint)uVar6 < 0) goto LAB_001c23bd;
    uVar7 = (ulong)((uint)uVar6 & 0x7fffffff);
    FVar1 = __first[uVar7].kind;
    __n = (LocationRange *)(ulong)FVar1;
  } while (FVar1 == FRAME_LOCAL);
  if (((FVar1 == FRAME_CALL) && (__first[uVar7].tailCall == true)) &&
     (__first[uVar7].thunks.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      __first[uVar7].thunks.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    while (uVar7 < uVar2) {
      (this->stack).
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar9 + -1;
      Frame::~Frame(pFVar9 + -1);
      __first = (this->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar9 = (this->stack).
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar2 = ((long)pFVar9 - (long)__first >> 4) * -0x70a3d70a3d70a3d7;
    }
    this->calls = this->calls - 1;
  }
LAB_001c23bd:
  if (this->limit <= this->calls) {
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"max stack frames exceeded.","");
    makeError(__return_storage_ptr__,this,loc,&local_60);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (pFVar9 == (this->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    lVar8 = (long)pFVar9 - (long)__first;
    if (lVar8 == 0x7fffffffffffff30) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar2 = (lVar8 >> 4) * -0x70a3d70a3d70a3d7;
    uVar6 = 1;
    if (pFVar9 != __first) {
      uVar6 = uVar2;
    }
    this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               *)(uVar6 + uVar2);
    if ((_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
         *)0x51eb851eb851ea < this_00) {
      this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 *)0x51eb851eb851eb;
    }
    __alloc = (_Tp_alloc_type *)(uVar6 + uVar2);
    if (CARRY8(uVar6,uVar2)) {
      this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 *)0x51eb851eb851eb;
    }
    __result = std::
               _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ::_M_allocate(this_00,(size_t)__n);
    Frame::Frame((Frame *)(lVar8 + (long)__result),(FrameKind *)0x6,loc);
    pFVar3 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__first,pFVar9,__result,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first,(long)(this->stack).
                                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first);
    }
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar3 + 1;
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    Frame::Frame(pFVar9,(FrameKind *)0x6,loc);
    pFVar3 = (this->stack).
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar3 + 1;
  }
  this->calls = this->calls + 1;
  pFVar3->context = local_40;
  (this->stack).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].self = local_38;
  pFVar9 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar9[-1].offset = offset;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::operator=(&pFVar9[-1].bindings,up_values);
  (this->stack).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].tailCall = false;
  p_Var4 = (up_values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(up_values->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    if (p_Var4[1]._M_parent == (_Base_ptr)0x0) break;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"INTERNAL ERROR: No binding for variable ",0x28);
  encode_utf8(&local_60,(internal *)**(undefined8 **)(p_Var4 + 1),
              (UString *)(*(undefined8 **)(p_Var4 + 1))[1]);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&local_60);
  abort();
}

Assistant:

void newCall(const LocationRange &loc, HeapEntity *context, HeapObject *self, unsigned offset,
                 const BindingFrame &up_values)
    {
        tailCallTrimStack();
        if (calls >= limit) {
            throw makeError(loc, "max stack frames exceeded.");
        }
        stack.emplace_back(FRAME_CALL, loc);
        calls++;
        top().context = context;
        top().self = self;
        top().offset = offset;
        top().bindings = up_values;
        top().tailCall = false;

#ifndef NDEBUG
        for (const auto &bind : up_values) {
            if (bind.second == nullptr) {
                std::cerr << "INTERNAL ERROR: No binding for variable "
                          << encode_utf8(bind.first->name) << std::endl;
                std::abort();
            }
        }
#endif
    }